

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O1

void __thiscall
PosixRunWriter::write_raw(PosixRunWriter *this,FileId base,uint8_t *start,uint8_t *end)

{
  iterator __position;
  uint uVar1;
  ulong __n;
  uint8_t *puVar2;
  long lVar3;
  byte bVar4;
  byte *__args;
  
  if (end != start) {
    bVar4 = *start;
    __n = (ulong)bVar4;
    uVar1 = bVar4 & 0x7f;
    puVar2 = start;
    if ((char)bVar4 < '\0') {
      __n = 7;
      do {
        bVar4 = puVar2[1];
        start = (uint8_t *)(ulong)bVar4;
        puVar2 = puVar2 + 1;
        uVar1 = uVar1 + ((bVar4 & 0x7f) << ((byte)__n & 0x1f));
        __n = (ulong)((int)__n + 7);
      } while ((char)bVar4 < '\0');
    }
    write(this,uVar1 + base,start,__n);
    __args = puVar2 + 1;
    if (__args < end) {
      puVar2 = end + ~(ulong)puVar2;
      bVar4 = 0;
      lVar3 = 0;
      do {
        *(long *)(this + 8) = *(long *)(this + 8) + 1;
        __position._M_current = *(uchar **)(this + 0x20);
        if (__position._M_current == *(uchar **)(this + 0x28)) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)(this + 0x18),__position
                     ,__args);
        }
        else {
          *__position._M_current = *__args;
          *(long *)(this + 0x20) = *(long *)(this + 0x20) + 1;
        }
        if (0x8000000 < (ulong)(*(long *)(this + 0x20) - *(long *)(this + 0x18))) {
          flush(this);
        }
        lVar3 = lVar3 + (ulong)((*__args & 0x7f) << (bVar4 & 0x1f));
        if ((char)*__args < '\0') {
          bVar4 = bVar4 + 7;
        }
        else {
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + lVar3 + 1;
          lVar3 = 0;
          bVar4 = 0;
        }
        __args = __args + 1;
        puVar2 = puVar2 + -1;
      } while (puVar2 != (uint8_t *)0x0);
    }
  }
  return;
}

Assistant:

void PosixRunWriter::write_raw(FileId base, uint8_t *start,
                               const uint8_t *end) {
    // Special case: when the range is empty, do nothing.
    if (end == start) {
        return;
    }
    // Decompress the first element and write it.
    uint64_t next = decompress_single(&start);
    write(base + next);

    // Write all the other bytes unchanged, and compute the new last element.
    uint64_t acc = 0;
    uint32_t shift = 0;
    for (const uint8_t *ptr = start; ptr < end; ++ptr) {
        out_bytes_++;
        buffer_.push_back(*ptr);
        if (buffer_.size() > RUN_BUFFER_SIZE) {
            flush();
        }
        acc += (*ptr & 0x7FU) << shift;
        shift += 7U;
        if ((*ptr & 0x80U) == 0) {
            prev_ += acc + 1;
            acc = 0;
            shift = 0;
        }
    }
}